

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O0

void __thiscall
Clasp::mt::ParallelHandler::ParallelHandler(ParallelHandler *this,ParallelSolve *ctrl,Solver *s)

{
  _func_int **in_RDX;
  PostPropagator *in_RSI;
  PostPropagator *in_RDI;
  
  MessageHandler::MessageHandler((MessageHandler *)in_RDI);
  (in_RDI->super_Constraint)._vptr_Constraint = (_func_int **)&PTR_propagate_002df270;
  std::thread::thread((thread *)0x21eb1e);
  in_RDI[2].next = in_RSI;
  in_RDI[3].super_Constraint._vptr_Constraint = in_RDX;
  in_RDI[3].next = (PostPropagator *)0x0;
  bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::pod_vector
            ((pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)in_RSI);
  *(undefined4 *)
   &(((PostPropagator *)&in_RDI[5].super_Constraint)->super_Constraint)._vptr_Constraint = 0;
  *(undefined4 *)
   ((long)&(((PostPropagator *)&in_RDI[5].super_Constraint)->super_Constraint)._vptr_Constraint + 4)
       = 0;
  *(uint *)&in_RDI[5].next = *(uint *)&in_RDI[5].next & 0xf0000000;
  *(uint *)&in_RDI[5].next = *(uint *)&in_RDI[5].next & 0xefffffff;
  *(uint *)&in_RDI[5].next = *(uint *)&in_RDI[5].next & 0xdfffffff;
  in_RDI->next = in_RDI;
  return;
}

Assistant:

ParallelHandler::ParallelHandler(ParallelSolve& ctrl, Solver& s)
	: MessageHandler()
	, ctrl_(&ctrl)
	, solver_(&s)
	, received_(0)
	, recEnd_(0)
	, intEnd_(0)
	, error_(0)
	, win_(0)
	, up_(0) {
	this->next = this;
}